

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

void iemgui_send(void *x,t_iemgui *iemgui,t_symbol *s)

{
  int iVar1;
  t_symbol *ptVar2;
  uint local_28;
  uint local_24;
  int oldsndrcvable;
  int sndable;
  t_symbol *s_local;
  t_iemgui *iemgui_local;
  void *x_local;
  
  local_28 = 0;
  if (((uint)iemgui->x_fsf >> 6 & 1) != 0) {
    local_28 = 2;
  }
  if (((uint)iemgui->x_fsf >> 7 & 1) != 0) {
    local_28 = local_28 | 1;
  }
  if (s == (t_symbol *)0x0) {
    iemgui->x_snd_unexpanded = &s_;
    iemgui->x_snd = (t_symbol *)0x0;
  }
  else {
    iemgui->x_snd_unexpanded = s;
    ptVar2 = canvas_realizedollar(iemgui->x_glist,s);
    iemgui->x_snd = ptVar2;
  }
  local_24 = (uint)(s != (t_symbol *)0x0);
  iemgui->x_fsf = (t_iem_fstyle_flags)((uint)iemgui->x_fsf & 0xffffff7f | local_24 << 7);
  iemgui_verify_snd_ne_rcv(iemgui);
  iVar1 = glist_isvisible(iemgui->x_glist);
  if (iVar1 != 0) {
    iVar1 = gobj_shouldvis((t_gobj *)x,iemgui->x_glist);
    if (iVar1 != 0) {
      (*iemgui->x_draw)(x,iemgui->x_glist,local_28 + 6);
    }
  }
  return;
}

Assistant:

void iemgui_send(void *x, t_iemgui *iemgui, t_symbol *s)
{
    int sndable=1, oldsndrcvable=0;

    if(iemgui->x_fsf.x_rcv_able)
        oldsndrcvable |= IEM_GUI_OLD_RCV_FLAG;
    if(iemgui->x_fsf.x_snd_able)
        oldsndrcvable |= IEM_GUI_OLD_SND_FLAG;

    if(s) {
        iemgui->x_snd_unexpanded = s;
        iemgui->x_snd = canvas_realizedollar(iemgui->x_glist, s);
    } else {
        iemgui->x_snd_unexpanded = &s_;
        iemgui->x_snd = 0;
        sndable = 0;
    }
    iemgui->x_fsf.x_snd_able = sndable;
    iemgui_verify_snd_ne_rcv(iemgui);
    if(glist_isvisible(iemgui->x_glist) && gobj_shouldvis((t_gobj *)x, iemgui->x_glist))
        (*iemgui->x_draw)(x, iemgui->x_glist, IEM_GUI_DRAW_MODE_IO + oldsndrcvable);
}